

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeShaderBuiltinVarTests.cpp
# Opt level: O0

void __thiscall
vkt::compute::anon_unknown_0::ComputeBuiltinVarInstance::ComputeBuiltinVarInstance
          (ComputeBuiltinVarInstance *this,Context *context,
          vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
          *subCases,DataType varType,ComputeBuiltinVarCase *builtinVarCase)

{
  deUint32 dVar1;
  VkDevice pVVar2;
  DeviceInterface *pDVar3;
  VkQueue pVVar4;
  ComputeBuiltinVarCase *builtinVarCase_local;
  DataType varType_local;
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  *subCases_local;
  Context *context_local;
  ComputeBuiltinVarInstance *this_local;
  
  TestInstance::TestInstance(&this->super_TestInstance,context);
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__ComputeBuiltinVarInstance_016aef80;
  pVVar2 = Context::getDevice((this->super_TestInstance).m_context);
  this->m_device = pVVar2;
  pDVar3 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  this->m_vki = pDVar3;
  pVVar4 = Context::getUniversalQueue(context);
  this->m_queue = pVVar4;
  dVar1 = Context::getUniversalQueueFamilyIndex(context);
  this->m_queueFamilyIndex = dVar1;
  std::
  vector<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
  ::vector(&this->m_subCases,subCases);
  this->m_builtin_var_case = builtinVarCase;
  this->m_subCaseNdx = 0;
  this->m_varType = varType;
  return;
}

Assistant:

ComputeBuiltinVarInstance::ComputeBuiltinVarInstance (Context&						context,
													  const vector<SubCase>&		subCases,
													  const glu::DataType			varType,
													  const ComputeBuiltinVarCase*	builtinVarCase)
	: vkt::TestInstance		(context)
	, m_device				(m_context.getDevice())
	, m_vki					(m_context.getDeviceInterface())
	, m_queue				(context.getUniversalQueue())
	, m_queueFamilyIndex	(context.getUniversalQueueFamilyIndex())
	, m_subCases			(subCases)
	, m_builtin_var_case	(builtinVarCase)
	, m_subCaseNdx			(0)
	, m_varType				(varType)
{
}